

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::val::ValidationState_t::GetComponentType(ValidationState_t *this,uint32_t id)

{
  short sVar1;
  long *plVar2;
  const_iterator cVar3;
  uint32_t id_00;
  key_type local_14;
  
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_14);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (plVar2 = *(long **)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10), plVar2 == (long *)0x0)) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x361,
                  "uint32_t spvtools::val::ValidationState_t::GetComponentType(uint32_t) const");
  }
  sVar1 = *(short *)((long)plVar2 + 0x3a);
  switch(sVar1) {
  case 0x14:
  case 0x15:
  case 0x16:
    break;
  case 0x18:
    id_00 = *(uint32_t *)(*plVar2 + 8);
    goto LAB_001a7051;
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_001a7028_caseD_19:
    id_00 = *(uint32_t *)(plVar2 + 8);
    if (id_00 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x37c,
                    "uint32_t spvtools::val::ValidationState_t::GetComponentType(uint32_t) const");
    }
LAB_001a7051:
    id = GetComponentType(this,id_00);
    break;
  default:
    if ((sVar1 != 0x1168) && (sVar1 != 0x14ee)) goto switchD_001a7028_caseD_19;
  case 0x17:
  case 0x1c:
    id = *(uint32_t *)(*plVar2 + 8);
  }
  return id;
}

Assistant:

uint32_t ValidationState_t::GetComponentType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  switch (inst->opcode()) {
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeBool:
      return id;

    case spv::Op::OpTypeArray:
      return inst->word(2);

    case spv::Op::OpTypeVector:
      return inst->word(2);

    case spv::Op::OpTypeMatrix:
      return GetComponentType(inst->word(2));

    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return inst->word(2);

    default:
      break;
  }

  if (inst->type_id()) return GetComponentType(inst->type_id());

  assert(0);
  return 0;
}